

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_sample.cpp
# Opt level: O3

unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true> __thiscall
duckdb::ReservoirSample::Copy(ReservoirSample *this)

{
  bool bVar1;
  _Head_base<0UL,_duckdb::BaseReservoirSampling_*,_false> __ptr;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Head_base<0UL,_duckdb::ReservoirSample_*,_false> _Var2;
  undefined1 auVar3 [8];
  undefined8 uVar4;
  undefined8 uVar5;
  _Head_base<0UL,_duckdb::RandomState_*,_false> _Var6;
  ReservoirSample *this_01;
  pointer pRVar7;
  DataChunk *pDVar8;
  idx_t iVar9;
  pointer pRVar10;
  DataChunk *other;
  ReservoirSample *in_RSI;
  idx_t iVar11;
  vector<duckdb::LogicalType,_true> types;
  SelectionVector sel_copy;
  _Head_base<0UL,_duckdb::ReservoirSample_*,_false> local_90;
  undefined1 local_88 [8];
  undefined1 local_80 [40];
  _Head_base<0UL,_duckdb::RandomState_*,_false> local_58;
  SelectionVector local_48;
  
  this_01 = (ReservoirSample *)operator_new(0x58);
  local_80._0_8_ = (_Head_base<0UL,_duckdb::ReservoirChunk_*,_false>)0x0;
  ReservoirSample(this_01,in_RSI->sample_count,
                  (unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>
                   *)local_80);
  uVar4 = local_80._0_8_;
  local_90._M_head_impl = this_01;
  if ((__uniq_ptr_impl<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>)
      local_80._0_8_ !=
      (__uniq_ptr_impl<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>)0x0) {
    DataChunk::~DataChunk((DataChunk *)local_80._0_8_);
    operator_delete((void *)uVar4);
  }
  bVar1 = in_RSI->stats_sample;
  pRVar7 = unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>::
           operator->((unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>
                       *)&local_90);
  pRVar7->stats_sample = bVar1;
  unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
  ::operator->(&(in_RSI->super_BlockingSample).base_reservoir_sample);
  BaseReservoirSampling::Copy((BaseReservoirSampling *)local_80);
  pRVar7 = unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>::
           operator->((unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>
                       *)&local_90);
  uVar4 = local_80._0_8_;
  local_80._0_8_ =
       (tuple<duckdb::ReservoirChunk_*,_std::default_delete<duckdb::ReservoirChunk>_>)0x0;
  __ptr._M_head_impl =
       (pRVar7->super_BlockingSample).base_reservoir_sample.
       super_unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::BaseReservoirSampling_*,_std::default_delete<duckdb::BaseReservoirSampling>_>
       .super__Head_base<0UL,_duckdb::BaseReservoirSampling_*,_false>._M_head_impl;
  (pRVar7->super_BlockingSample).base_reservoir_sample.
  super_unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::BaseReservoirSampling_*,_std::default_delete<duckdb::BaseReservoirSampling>_>
  .super__Head_base<0UL,_duckdb::BaseReservoirSampling_*,_false>._M_head_impl =
       (BaseReservoirSampling *)uVar4;
  if ((__ptr._M_head_impl != (BaseReservoirSampling *)0x0) &&
     (::std::default_delete<duckdb::BaseReservoirSampling>::operator()
                ((default_delete<duckdb::BaseReservoirSampling> *)
                 &(pRVar7->super_BlockingSample).base_reservoir_sample,__ptr._M_head_impl),
     (_Head_base<0UL,_duckdb::ReservoirChunk_*,_false>)local_80._0_8_ !=
     (_Head_base<0UL,_duckdb::ReservoirChunk_*,_false>)0x0)) {
    ::std::default_delete<duckdb::BaseReservoirSampling>::operator()
              ((default_delete<duckdb::BaseReservoirSampling> *)local_80,
               (BaseReservoirSampling *)local_80._0_8_);
  }
  bVar1 = (in_RSI->super_BlockingSample).destroyed;
  pRVar7 = unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>::
           operator->((unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>
                       *)&local_90);
  (pRVar7->super_BlockingSample).destroyed = bVar1;
  if (((in_RSI->reservoir_chunk).
       super_unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>._M_t.
       super___uniq_ptr_impl<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::ReservoirChunk_*,_std::default_delete<duckdb::ReservoirChunk>_>
       .super__Head_base<0UL,_duckdb::ReservoirChunk_*,_false>._M_head_impl == (ReservoirChunk *)0x0
      ) || ((in_RSI->super_BlockingSample).destroyed == true)) {
    (this->super_BlockingSample)._vptr_BlockingSample = (_func_int **)local_90._M_head_impl;
  }
  else {
    pDVar8 = &unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>
              ::operator->(&in_RSI->reservoir_chunk)->chunk;
    DataChunk::GetTypes((vector<duckdb::LogicalType,_true> *)local_80,pDVar8);
    iVar9 = GetActiveSampleCount(in_RSI);
    if (in_RSI->sample_count <= iVar9) {
      iVar9 = in_RSI->sample_count;
    }
    CreateNewSampleChunk
              ((ReservoirSample *)local_88,(vector<duckdb::LogicalType,_true> *)in_RSI,
               (idx_t)local_80);
    local_48.selection_data.internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_48.selection_data.internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    shared_ptr<duckdb::SelectionData,_true>::operator=
              (&local_48.selection_data,&(in_RSI->sel).selection_data);
    local_48.sel_vector = (in_RSI->sel).sel_vector;
    pRVar7 = unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>
             ::operator->((unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>
                           *)&local_90);
    auVar3 = local_88;
    local_88 = (undefined1  [8])0x0;
    ::std::__uniq_ptr_impl<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>::
    reset((__uniq_ptr_impl<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_> *)
          &pRVar7->reservoir_chunk,(pointer)auVar3);
    pRVar7 = unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>
             ::operator->((unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>
                           *)&local_90);
    pRVar10 = unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>
              ::operator->((unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>
                            *)&local_90);
    pDVar8 = &unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>
              ::operator->(&pRVar10->reservoir_chunk)->chunk;
    other = &unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>::
             operator->(&in_RSI->reservoir_chunk)->chunk;
    UpdateSampleAppend(pRVar7,pDVar8,other,&local_48,iVar9);
    SelectionVector::SelectionVector((SelectionVector *)(local_80 + 0x18),iVar9);
    pRVar7 = unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>
             ::operator->((unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>
                           *)&local_90);
    _Var6._M_head_impl = (RandomState *)local_58;
    uVar5 = local_80._32_8_;
    uVar4 = local_80._24_8_;
    local_80._24_8_ = (__pthread_internal_list *)0x0;
    local_80._32_8_ = (__pthread_internal_list *)0x0;
    local_58._M_head_impl = (RandomState *)0x0;
    (pRVar7->sel).sel_vector = (sel_t *)uVar4;
    (pRVar7->sel).selection_data.internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)uVar5;
    this_00 = (pRVar7->sel).selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    (pRVar7->sel).selection_data.internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var6._M_head_impl;
    if ((this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00),
       (_Head_base<0UL,_duckdb::RandomState_*,_false>)local_58._M_head_impl !=
       (_Head_base<0UL,_duckdb::RandomState_*,_false>)0x0)) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_head_impl);
    }
    if (iVar9 != 0) {
      iVar11 = 0;
      do {
        pRVar7 = unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>
                 ::operator->((unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>
                               *)&local_90);
        (pRVar7->sel).sel_vector[iVar11] = (sel_t)iVar11;
        iVar11 = iVar11 + 1;
      } while (iVar9 != iVar11);
    }
    iVar9 = in_RSI->sel_size;
    pRVar7 = unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>
             ::operator->((unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>
                           *)&local_90);
    pRVar7->sel_size = iVar9;
    unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>::
    operator->((unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>
                *)&local_90);
    _Var2._M_head_impl = local_90._M_head_impl;
    local_90._M_head_impl = (ReservoirSample *)0x0;
    (this->super_BlockingSample)._vptr_BlockingSample = (_func_int **)_Var2._M_head_impl;
    if (local_48.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_48.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    auVar3 = local_88;
    if (local_88 != (undefined1  [8])0x0) {
      DataChunk::~DataChunk((DataChunk *)local_88);
      operator_delete((void *)auVar3);
    }
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_80);
    if (local_90._M_head_impl != (ReservoirSample *)0x0) {
      (*((local_90._M_head_impl)->super_BlockingSample)._vptr_BlockingSample[1])();
    }
  }
  return (unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>)
         (unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>)this;
}

Assistant:

unique_ptr<BlockingSample> ReservoirSample::Copy() const {

	auto ret = make_uniq<ReservoirSample>(sample_count);
	ret->stats_sample = stats_sample;

	ret->base_reservoir_sample = base_reservoir_sample->Copy();
	ret->destroyed = destroyed;

	if (!reservoir_chunk || destroyed) {
		return unique_ptr_cast<ReservoirSample, BlockingSample>(std::move(ret));
	}

	D_ASSERT(reservoir_chunk);

	// create a new sample chunk to store new samples
	auto types = reservoir_chunk->chunk.GetTypes();
	// how many values should be copied
	idx_t values_to_copy = MinValue<idx_t>(GetActiveSampleCount(), sample_count);

	auto new_sample_chunk = CreateNewSampleChunk(types, GetReservoirChunkCapacity<idx_t>());

	SelectionVector sel_copy(sel);

	ret->reservoir_chunk = std::move(new_sample_chunk);
	ret->UpdateSampleAppend(ret->reservoir_chunk->chunk, reservoir_chunk->chunk, sel_copy, values_to_copy);
	ret->sel = SelectionVector(values_to_copy);
	for (idx_t i = 0; i < values_to_copy; i++) {
		ret->sel.set_index(i, i);
	}
	ret->sel_size = sel_size;
	D_ASSERT(ret->reservoir_chunk->chunk.size() <= sample_count);
	ret->Verify();
	return unique_ptr_cast<ReservoirSample, BlockingSample>(std::move(ret));
}